

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wal.cc
# Opt level: O2

wal_item * wal_itr_next(wal_iterator *wal_itr)

{
  bool bVar1;
  avl_node *paVar2;
  long lVar3;
  wal_item_header *header;
  wal_item *pwVar4;
  avl_node *paVar5;
  code *func;
  avl_node *paVar6;
  long lVar7;
  avl_node local_68;
  avl_node *paStack_50;
  avl_node *local_48;
  avl_node *paStack_40;
  
  if (wal_itr->shandle->is_persisted_snapshot == true) {
    paVar2 = avl_next(wal_itr->cursor_pos);
    wal_itr->cursor_pos = paVar2;
    if (wal_itr->by_key == true) {
      pwVar4 = (wal_item *)&paVar2[-5].right;
    }
    else {
      pwVar4 = (wal_item *)&paVar2[-1].left;
    }
    if (paVar2 != (avl_node *)0x0) {
      return pwVar4;
    }
    return (wal_item *)0x0;
  }
  if (wal_itr->shandle->snap_tag_idx == 0) {
LAB_001356fe:
    pwVar4 = (wal_item *)0x0;
  }
  else {
    if (wal_itr->direction == '\x01') {
      paVar2 = wal_itr->cursor_pos;
      if (paVar2 == (avl_node *)0x0) goto LAB_001356fe;
      if (wal_itr->by_key == true) {
        local_68.parent = paVar2->parent;
        local_68.left = paVar2->left;
        local_68.right = paVar2->right;
        paStack_50 = paVar2[1].parent;
        local_48 = paVar2[1].left;
        paStack_40 = paVar2[1].right;
        paVar5 = paStack_50[1].right;
        lVar7 = (long)paVar2 - (long)wal_itr->cursors;
        lVar3 = lVar7 / 0x30;
        wal_itr->item_prev = (wal_item *)paVar2[1].parent;
        pthread_spin_lock(&wal_itr->map_shards[lVar3].lock);
        avl_set_aux(&wal_itr->map_shards[lVar3]._map,&wal_itr->shandle->cmp_info);
        header = (wal_item_header *)avl_next(paVar5);
        if (header == (wal_item_header *)0x0) {
          pwVar4 = (wal_item *)0x0;
        }
        else {
          do {
            bVar1 = _wal_is_my_kvs(header,wal_itr);
            pwVar4 = (wal_item *)0x0;
            if ((!bVar1) ||
               (pwVar4 = _wal_get_snap_item(header,wal_itr->shandle), pwVar4 != (wal_item *)0x0))
            break;
            header = (wal_item_header *)avl_next(&header->avl_key);
            pwVar4 = (wal_item *)0x0;
          } while (header != (wal_item_header *)0x0);
        }
        pthread_spin_unlock(&wal_itr->map_shards[lVar3].lock);
        avl_remove(&wal_itr->merge_tree,paVar2);
        paVar2 = (avl_node *)(lVar7 + (long)wal_itr->cursors);
        if (pwVar4 == (wal_item *)0x0) {
          paVar2[1].parent = (avl_node *)0x0;
        }
        else {
          paVar2[1].parent = (avl_node *)pwVar4;
          avl_insert(&wal_itr->merge_tree,paVar2,_merge_cmp_bykey);
        }
        func = _merge_cmp_bykey;
      }
      else {
        local_68.parent = paVar2->parent;
        local_68.left = paVar2->left;
        local_68.right = paVar2->right;
        paStack_50 = paVar2[1].parent;
        local_48 = paVar2[1].left;
        paStack_40 = paVar2[1].right;
        lVar7 = (long)paVar2 - (long)wal_itr->cursors;
        lVar3 = lVar7 / 0x30;
        wal_itr->item_prev = (wal_item *)paVar2[1].parent;
        pthread_spin_lock(&wal_itr->map_shards[lVar3].lock);
        paVar5 = (avl_node *)&paStack_50->right;
        do {
          paVar5 = avl_next(paVar5);
          if ((paVar5 == (avl_node *)0x0) ||
             (bVar1 = _wal_is_my_kvs((wal_item_header *)paVar5[1].parent,wal_itr), !bVar1)) {
            paVar6 = (avl_node *)0x0;
            break;
          }
          paVar6 = (avl_node *)&paVar5[-1].left;
          pwVar4 = _wal_get_snap_item((wal_item_header *)paVar5[1].parent,wal_itr->shandle);
        } while ((wal_item *)paVar6 != pwVar4);
        pthread_spin_unlock(&wal_itr->map_shards[lVar3].lock);
        avl_remove(&wal_itr->merge_tree,paVar2);
        paVar2 = (avl_node *)(lVar7 + (long)wal_itr->cursors);
        if (paVar6 == (avl_node *)0x0) {
          paVar2[1].parent = (avl_node *)0x0;
        }
        else {
          paVar2[1].parent = paVar6;
          avl_insert(&wal_itr->merge_tree,paVar2,_merge_cmp_byseq);
        }
        func = _merge_cmp_byseq;
      }
      paVar2 = avl_search_greater(&wal_itr->merge_tree,&local_68,func);
      wal_itr->cursor_pos = paVar2;
      if (paVar2 == (avl_node *)0x0) {
        pwVar4 = (wal_item *)0x0;
      }
      else {
        pwVar4 = (wal_item *)paVar2[1].parent;
      }
    }
    else {
      pwVar4 = wal_itr->item_prev;
      if (pwVar4 == (wal_item *)0x0) goto LAB_001356fe;
      if (wal_itr->by_key == true) {
        pwVar4 = _wal_itr_search_greater_bykey(wal_itr,pwVar4);
      }
      else {
        pwVar4 = _wal_itr_search_greater_byseq(wal_itr,pwVar4);
      }
    }
    wal_itr->direction = '\x01';
  }
  return pwVar4;
}

Assistant:

struct wal_item* wal_itr_next(struct wal_iterator *wal_itr)
{
    struct wal_item *result = NULL;
    if (wal_itr->shandle->is_persisted_snapshot) {
        wal_itr->cursor_pos = avl_next(wal_itr->cursor_pos);
        if (wal_itr->by_key) {
            return wal_itr->cursor_pos ? _get_entry(wal_itr->cursor_pos,
                                                struct wal_item, avl_keysnap) : NULL;
        } else {
            return wal_itr->cursor_pos ? _get_entry(wal_itr->cursor_pos,
                                                struct wal_item, avl_seq) : NULL;
        }
    }

    if (!wal_itr->shandle->snap_tag_idx) { // no items in WAL in snapshot..
        return NULL;
    }
    if (wal_itr->direction == FDB_ITR_FORWARD) {
        if (!wal_itr->cursor_pos) {
            return result;
        }
        if (wal_itr->by_key) {
            result = _wal_itr_next_bykey(wal_itr);
        } else {
            result = _wal_itr_next_byseq(wal_itr);
        }
    } else { // change of direction involves searching across all shards..
        if (!wal_itr->item_prev) {
            return result;
        }
        if (wal_itr->by_key) {
            result = _wal_itr_search_greater_bykey(wal_itr,
                                                   wal_itr->item_prev);
        } else {
            result = _wal_itr_search_greater_byseq(wal_itr,
                                                   wal_itr->item_prev);
        }
    }
    wal_itr->direction = FDB_ITR_FORWARD;
    return result;
}